

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *interfaceNode,Reader *replacement)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  Iterator IVar6;
  Reader local_2b0;
  Reader local_280;
  uint local_250;
  uint local_24c;
  uint i;
  uint local_244;
  undefined1 local_240 [4];
  uint count;
  Reader replacementMethods;
  Reader methods;
  unsigned_long *replacementIter;
  unsigned_long *iter;
  undefined1 local_1c8 [8];
  Reader superclass_1;
  undefined1 local_188 [8];
  Iterator __end2_1;
  undefined1 local_168 [8];
  Iterator __begin2_1;
  Reader *__range2_1;
  undefined1 local_118 [8];
  Reader superclass;
  undefined1 local_d8 [8];
  Iterator __end2;
  undefined1 local_b8 [8];
  Iterator __begin2;
  Reader *__range2;
  undefined1 local_60 [8];
  Vector<unsigned_long> replacementSuperclasses;
  Vector<unsigned_long> superclasses;
  Reader *replacement_local;
  Reader *interfaceNode_local;
  CompatibilityChecker *this_local;
  
  kj::Vector<unsigned_long>::Vector
            ((Vector<unsigned_long> *)&replacementSuperclasses.builder.disposer);
  kj::Vector<unsigned_long>::Vector((Vector<unsigned_long> *)local_60);
  capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&__begin2.index,interfaceNode);
  IVar6 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::begin((Reader *)&__begin2.index);
  __end2._8_8_ = IVar6.container;
  __begin2.container._0_4_ = IVar6.index;
  local_b8 = (undefined1  [8])__end2._8_8_;
  IVar6 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::end((Reader *)&__begin2.index);
  superclass._reader._40_8_ = IVar6.container;
  __end2.container._0_4_ = IVar6.index;
  local_d8 = (undefined1  [8])superclass._reader._40_8_;
  while (bVar1 = _::
                 IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                 ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                               *)local_b8,
                              (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                               *)local_d8), ((bVar1 ^ 0xffU) & 1) != 0) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator*((Reader *)local_118,
                (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                 *)local_b8);
    __range2_1 = (Reader *)capnp::schema::Superclass::Reader::getId((Reader *)local_118);
    kj::Vector<unsigned_long>::add<unsigned_long>
              ((Vector<unsigned_long> *)&replacementSuperclasses.builder.disposer,
               (unsigned_long *)&__range2_1);
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                  *)local_b8);
  }
  capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&__begin2_1.index,replacement);
  IVar6 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)&__begin2_1.index);
  __end2_1._8_8_ = IVar6.container;
  __begin2_1.container._0_4_ = IVar6.index;
  local_168 = (undefined1  [8])__end2_1._8_8_;
  IVar6 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::end((Reader *)&__begin2_1.index);
  superclass_1._reader._40_8_ = IVar6.container;
  __end2_1.container._0_4_ = IVar6.index;
  local_188 = (undefined1  [8])superclass_1._reader._40_8_;
  while (bVar1 = _::
                 IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                 ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                               *)local_168,
                              (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                               *)local_188), ((bVar1 ^ 0xffU) & 1) != 0) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator*((Reader *)local_1c8,
                (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                 *)local_168);
    iter = (unsigned_long *)capnp::schema::Superclass::Reader::getId((Reader *)local_1c8);
    kj::Vector<unsigned_long>::add<unsigned_long>
              ((Vector<unsigned_long> *)local_60,(unsigned_long *)&iter);
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                  *)local_168);
  }
  puVar4 = kj::Vector<unsigned_long>::begin
                     ((Vector<unsigned_long> *)&replacementSuperclasses.builder.disposer);
  puVar5 = kj::Vector<unsigned_long>::end
                     ((Vector<unsigned_long> *)&replacementSuperclasses.builder.disposer);
  std::sort<unsigned_long*>(puVar4,puVar5);
  puVar4 = kj::Vector<unsigned_long>::begin((Vector<unsigned_long> *)local_60);
  puVar5 = kj::Vector<unsigned_long>::end((Vector<unsigned_long> *)local_60);
  std::sort<unsigned_long*>(puVar4,puVar5);
  replacementIter =
       kj::Vector<unsigned_long>::begin
                 ((Vector<unsigned_long> *)&replacementSuperclasses.builder.disposer);
  methods.reader._40_8_ = kj::Vector<unsigned_long>::begin((Vector<unsigned_long> *)local_60);
  while( true ) {
    puVar4 = kj::Vector<unsigned_long>::end
                       ((Vector<unsigned_long> *)&replacementSuperclasses.builder.disposer);
    bVar1 = true;
    if (replacementIter == puVar4) {
      puVar4 = kj::Vector<unsigned_long>::end((Vector<unsigned_long> *)local_60);
      bVar1 = (unsigned_long *)methods.reader._40_8_ != puVar4;
    }
    if (!bVar1) goto LAB_0018e002;
    puVar4 = kj::Vector<unsigned_long>::end
                       ((Vector<unsigned_long> *)&replacementSuperclasses.builder.disposer);
    if (replacementIter == puVar4) break;
    puVar4 = kj::Vector<unsigned_long>::end((Vector<unsigned_long> *)local_60);
    if ((unsigned_long *)methods.reader._40_8_ == puVar4) {
      replacementIsOlder(this);
LAB_0018e002:
      kj::Vector<unsigned_long>::~Vector((Vector<unsigned_long> *)local_60);
      kj::Vector<unsigned_long>::~Vector
                ((Vector<unsigned_long> *)&replacementSuperclasses.builder.disposer);
      capnp::schema::Node::Interface::Reader::getMethods
                ((Reader *)&replacementMethods.reader.nestingLimit,interfaceNode);
      capnp::schema::Node::Interface::Reader::getMethods((Reader *)local_240,replacement);
      uVar2 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::size((Reader *)local_240);
      uVar3 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::size
                        ((Reader *)&replacementMethods.reader.nestingLimit);
      if (uVar3 < uVar2) {
        replacementIsNewer(this);
      }
      else {
        uVar2 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::size((Reader *)local_240);
        uVar3 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::size
                          ((Reader *)&replacementMethods.reader.nestingLimit);
        if (uVar2 < uVar3) {
          replacementIsOlder(this);
        }
      }
      i = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&replacementMethods.reader.nestingLimit);
      local_24c = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::size((Reader *)local_240);
      local_244 = kj::min<unsigned_int,unsigned_int>(&i,&local_24c);
      for (local_250 = 0; local_250 < local_244; local_250 = local_250 + 1) {
        List<capnp::schema::Method,_(capnp::Kind)3>::Reader::operator[]
                  (&local_280,(Reader *)&replacementMethods.reader.nestingLimit,local_250);
        List<capnp::schema::Method,_(capnp::Kind)3>::Reader::operator[]
                  (&local_2b0,(Reader *)local_240,local_250);
        checkCompatibility(this,&local_280,&local_2b0);
      }
      return;
    }
    if (*replacementIter < *(ulong *)methods.reader._40_8_) {
      replacementIsOlder(this);
      replacementIter = replacementIter + 1;
    }
    else {
      if (*(ulong *)methods.reader._40_8_ < *replacementIter) {
        replacementIsNewer(this);
      }
      else {
        replacementIter = replacementIter + 1;
      }
      methods.reader._40_8_ = methods.reader._40_8_ + 8;
    }
  }
  replacementIsNewer(this);
  goto LAB_0018e002;
}

Assistant:

void checkCompatibility(const schema::Node::Interface::Reader& interfaceNode,
                          const schema::Node::Interface::Reader& replacement) {
    {
      // Check superclasses.

      kj::Vector<uint64_t> superclasses;
      kj::Vector<uint64_t> replacementSuperclasses;
      for (auto superclass: interfaceNode.getSuperclasses()) {
        superclasses.add(superclass.getId());
      }
      for (auto superclass: replacement.getSuperclasses()) {
        replacementSuperclasses.add(superclass.getId());
      }
      std::sort(superclasses.begin(), superclasses.end());
      std::sort(replacementSuperclasses.begin(), replacementSuperclasses.end());

      auto iter = superclasses.begin();
      auto replacementIter = replacementSuperclasses.begin();

      while (iter != superclasses.end() || replacementIter != replacementSuperclasses.end()) {
        if (iter == superclasses.end()) {
          replacementIsNewer();
          break;
        } else if (replacementIter == replacementSuperclasses.end()) {
          replacementIsOlder();
          break;
        } else if (*iter < *replacementIter) {
          replacementIsOlder();
          ++iter;
        } else if (*iter > *replacementIter) {
          replacementIsNewer();
          ++replacementIter;
        } else {
          ++iter;
          ++replacementIter;
        }
      }
    }

    auto methods = interfaceNode.getMethods();
    auto replacementMethods = replacement.getMethods();

    if (replacementMethods.size() > methods.size()) {
      replacementIsNewer();
    } else if (replacementMethods.size() < methods.size()) {
      replacementIsOlder();
    }

    uint count = kj::min(methods.size(), replacementMethods.size());

    for (uint i = 0; i < count; i++) {
      checkCompatibility(methods[i], replacementMethods[i]);
    }
  }